

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O1

void __thiscall EmmyFacade::InitReq(EmmyFacade *this,InitParams *params)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  
  if ((this->StartHook).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->StartHook)._M_invoker)((_Any_data *)this);
  }
  std::__cxx11::string::_M_assign((string *)&(this->_emmyDebuggerManager).helperCode);
  this_00 = &(this->_emmyDebuggerManager).extNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_00,&params->ext);
  EmmyDebuggerManager::SetRunning(&this->_emmyDebuggerManager,true);
  LOCK();
  (this->readyHook)._M_base._M_i = true;
  UNLOCK();
  return;
}

Assistant:

void EmmyFacade::InitReq(InitParams & params) {
	if (StartHook) {
		StartHook();
	}

	_emmyDebuggerManager.helperCode = params.emmyHelper;
	_emmyDebuggerManager.extNames.clear();
	_emmyDebuggerManager.extNames = params.ext;

	// 这里有个线程安全问题，消息线程和lua 执行线程不是相同线程，但是没有一个锁能让我做同步
	// 所以我不能在这里访问lua state 指针的内部结构
	//
	// 方案：提前为主state 设置hook 利用hook 实现同步

	// fix 以上安全问题
	StartDebug();
}